

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtTriangleInfoMap * __thiscall
cbtCollisionWorldImporter::createTriangleInfoMap(cbtCollisionWorldImporter *this)

{
  cbtTriangleInfoMap *this_00;
  cbtTriangleInfoMap *tim;
  cbtTriangleInfoMap *local_20;
  
  this_00 = (cbtTriangleInfoMap *)::operator_new(0xa0);
  cbtTriangleInfoMap::cbtTriangleInfoMap(this_00);
  local_20 = this_00;
  cbtAlignedObjectArray<cbtTriangleInfoMap_*>::push_back
            (&this->m_allocatedTriangleInfoMaps,&local_20);
  return local_20;
}

Assistant:

cbtTriangleInfoMap* cbtCollisionWorldImporter::createTriangleInfoMap()
{
	cbtTriangleInfoMap* tim = new cbtTriangleInfoMap();
	m_allocatedTriangleInfoMaps.push_back(tim);
	return tim;
}